

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nnls.h
# Opt level: O2

void __thiscall
Eigen::NNLS<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::_remFromP
          (NNLS<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *this,Index idx)

{
  PermutationType *this_00;
  Scalar SVar1;
  Scalar *pSVar2;
  Scalar *pSVar3;
  long lVar4;
  Index i;
  Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> local_68;
  
  this_00 = &this->_P;
  pSVar2 = DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>,_1> *)this_00,idx);
  pSVar3 = DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>,_1> *)this_00,
                      this->_Np + -1);
  SVar1 = *pSVar2;
  *pSVar2 = *pSVar3;
  *pSVar3 = SVar1;
  lVar4 = this->_Np + -1;
  this->_Np = lVar4;
  for (; idx < lVar4; idx = idx + 1) {
    pSVar2 = DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>,_1> *)this_00,idx);
    Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block(&local_68,&this->_A,*pSVar2);
    internal::
    nnls_householder_qr_inplace_update<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,1,true>>
              (&this->_QR,&this->_qrCoeffs,&local_68,idx,
               (this->_tempVector).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
               m_storage.m_data);
    lVar4 = this->_Np;
  }
  return;
}

Assistant:

void NNLS<MatrixType>::_remFromP(Index idx)
{
#ifdef EIGEN3_NNLS_DEBUG
  std::cerr << "NNLS(): Remove Idx " << _P.indices()(idx) << "@" << idx << " from passive set ("
            << _P.indices().head(_Np).transpose() << ")" << std::endl;
#endif
  // swap index with last passive one & reduce number of passive columns
  std::swap(_P.indices()(idx), _P.indices()(_Np-1)); _Np--;
  // Update QR decomposition starting from the removed index up to the end [idx, ..., _Np]
  for (Index i=idx; i<_Np; i++) {
    Index col = _P.indices()(i);
    internal::nnls_householder_qr_inplace_update(_QR, _qrCoeffs, _A.col(col), i, _tempVector.data());
  }
}